

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

_Bool rf_format_pixels_to_normalized
                (void *src,rf_int src_size,rf_uncompressed_pixel_format src_format,rf_vec4 *dst,
                rf_int dst_size)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  rf_source_location source_location;
  uint uVar3;
  rf_int dst_iter;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  undefined8 in_R9;
  float *pfVar8;
  long in_FS_OFFSET;
  float fVar9;
  undefined1 auVar10 [16];
  rf_vec4 rVar11;
  
  uVar3 = rf_bytes_per_pixel(src_format);
  uVar6 = (ulong)uVar3;
  lVar4 = src_size / (long)uVar6;
  if ((long)((ulong)dst_size >> 4) < lVar4) {
    source_location.proc_name = "rf_format_pixels_to_normalized";
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.line_in_file = 0x32d;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Buffer is size %d but function expected a size of at least %d.",4,dst_size,
                lVar4 << 4,in_R9);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_format_pixels_to_normalized";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x32d;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 4;
  }
  else {
    switch(src_format) {
    case RF_UNCOMPRESSED_GRAYSCALE:
      pfVar8 = &dst->w;
      lVar5 = 0;
      for (lVar7 = 0; (lVar5 < src_size && (lVar7 < dst_size)); lVar7 = lVar7 + 1) {
        fVar9 = (float)*(byte *)((long)src + lVar5) / 255.0;
        ((rf_vec4 *)(pfVar8 + -3))->x = fVar9;
        pfVar8[-2] = fVar9;
        pfVar8[-1] = fVar9;
        *pfVar8 = 1.0;
        lVar5 = lVar5 + uVar6;
        pfVar8 = pfVar8 + 4;
      }
      break;
    case RF_UNCOMPRESSED_GRAY_ALPHA:
      lVar5 = 0;
      for (lVar7 = 0; (lVar5 < src_size && (lVar7 < dst_size)); lVar7 = lVar7 + 1) {
        auVar10._0_4_ = (float)(*(ushort *)((long)src + lVar5) & 0xff);
        auVar10._4_4_ = auVar10._0_4_;
        auVar10._8_4_ = auVar10._0_4_;
        auVar10._12_4_ = (float)(byte)(*(ushort *)((long)src + lVar5) >> 8);
        auVar2._8_4_ = 0x437f0000;
        auVar2._0_8_ = 0x437f0000437f0000;
        auVar2._12_4_ = 0x437f0000;
        rVar11 = (rf_vec4)divps(auVar10,auVar2);
        *dst = rVar11;
        lVar5 = lVar5 + uVar6;
        dst = dst + 1;
      }
      break;
    case RF_UNCOMPRESSED_R5G6B5:
      pfVar8 = &dst->w;
      lVar7 = 0;
      for (lVar5 = 0; (lVar7 < src_size && (lVar5 < dst_size)); lVar5 = lVar5 + 1) {
        uVar1 = *(ushort *)((long)src + lVar7 * 2);
        ((rf_vec4 *)(pfVar8 + -3))->x = (float)(uVar1 >> 0xb) * 0.032258064;
        pfVar8[-2] = (float)(uVar1 >> 5 & 0x3f) * 0.015873017;
        pfVar8[-1] = (float)(uVar1 & 0x1f) * 0.032258064;
        *pfVar8 = 1.0;
        lVar7 = lVar7 + uVar6;
        pfVar8 = pfVar8 + 4;
      }
      break;
    case RF_UNCOMPRESSED_R8G8B8:
      pfVar8 = &dst->w;
      lVar7 = 0;
      for (lVar5 = 0; (lVar7 < src_size && (lVar5 < dst_size)); lVar5 = lVar5 + 1) {
        ((rf_vec4 *)(pfVar8 + -3))->x = (float)*(byte *)((long)src + lVar7) / 255.0;
        pfVar8[-2] = (float)*(byte *)((long)src + lVar7 + 1) / 255.0;
        pfVar8[-1] = (float)*(byte *)((long)src + lVar7 + 2) / 255.0;
        *pfVar8 = 1.0;
        lVar7 = lVar7 + uVar6;
        pfVar8 = pfVar8 + 4;
      }
      break;
    case RF_UNCOMPRESSED_R5G5B5A1:
      pfVar8 = &dst->w;
      lVar5 = 0;
      for (lVar7 = 0; (lVar5 < src_size && (lVar7 < dst_size)); lVar7 = lVar7 + 1) {
        uVar1 = *(ushort *)((long)src + lVar5 * 2);
        ((rf_vec4 *)(pfVar8 + -3))->x = (float)(uVar1 >> 0xb) * 0.032258064;
        pfVar8[-2] = (float)(uVar1 >> 6 & 0x1f) * 0.032258064;
        pfVar8[-1] = (float)(uVar1 >> 1 & 0x1f) * 0.032258064;
        fVar9 = 0.0;
        if ((uVar1 & 1) != 0) {
          fVar9 = 1.0;
        }
        *pfVar8 = fVar9;
        lVar5 = lVar5 + uVar6;
        pfVar8 = pfVar8 + 4;
      }
      break;
    case RF_UNCOMPRESSED_R4G4B4A4:
      pfVar8 = &dst->w;
      lVar7 = 0;
      for (lVar5 = 0; (lVar7 < src_size && (lVar5 < dst_size)); lVar5 = lVar5 + 1) {
        uVar1 = *(ushort *)((long)src + lVar7 * 2);
        ((rf_vec4 *)(pfVar8 + -3))->x = (float)(uVar1 >> 0xc) * 0.06666667;
        pfVar8[-2] = (float)(uVar1 >> 8 & 0xf) * 0.06666667;
        pfVar8[-1] = (float)(uVar1 >> 4 & 0xf) * 0.06666667;
        *pfVar8 = (float)(uVar1 & 0xf) * 0.06666667;
        lVar7 = lVar7 + uVar6;
        pfVar8 = pfVar8 + 4;
      }
      break;
    case RF_UNCOMPRESSED_R8G8B8A8:
      pfVar8 = &dst->w;
      lVar7 = 0;
      for (lVar5 = 0; (lVar7 < src_size && (lVar5 < dst_size)); lVar5 = lVar5 + 1) {
        ((rf_vec4 *)(pfVar8 + -3))->x = (float)*(byte *)((long)src + lVar7) / 255.0;
        pfVar8[-2] = (float)*(byte *)((long)src + lVar7 + 1) / 255.0;
        pfVar8[-1] = (float)*(byte *)((long)src + lVar7 + 2) / 255.0;
        *pfVar8 = (float)*(byte *)((long)src + lVar7 + 3) / 255.0;
        lVar7 = lVar7 + uVar6;
        pfVar8 = pfVar8 + 4;
      }
      break;
    case RF_UNCOMPRESSED_R32:
      lVar7 = 0;
      for (lVar5 = 0; (lVar7 < src_size && (lVar5 < dst_size)); lVar5 = lVar5 + 1) {
        dst->x = *(float *)((long)src + lVar7 * 4);
        dst->y = 0.0;
        dst->z = 0.0;
        dst->w = 1.0;
        lVar7 = lVar7 + uVar6;
        dst = dst + 1;
      }
      break;
    case RF_UNCOMPRESSED_R32G32B32:
      pfVar8 = &dst->w;
      lVar7 = 0;
      for (lVar5 = 0; (lVar7 < src_size && (lVar5 < dst_size)); lVar5 = lVar5 + 1) {
        ((rf_vec4 *)(pfVar8 + -3))->x = *(float *)((long)src + lVar7 * 4);
        pfVar8[-2] = *(float *)((long)src + lVar7 * 4 + 4);
        pfVar8[-1] = *(float *)((long)src + lVar7 * 4 + 8);
        *pfVar8 = 1.0;
        lVar7 = lVar7 + uVar6;
        pfVar8 = pfVar8 + 4;
      }
      break;
    case RF_UNCOMPRESSED_NORMALIZED:
      memcpy(dst,src,src_size);
    }
  }
  return lVar4 <= (long)((ulong)dst_size >> 4);
}

Assistant:

RF_API bool rf_format_pixels_to_normalized(const void* src, rf_int src_size, rf_uncompressed_pixel_format src_format, rf_vec4* dst, rf_int dst_size)
{
    bool success = false;

    rf_int src_bpp = rf_bytes_per_pixel(src_format);
    rf_int src_pixel_count = src_size / src_bpp;
    rf_int dst_pixel_count = dst_size / sizeof(rf_vec4);

    if (dst_pixel_count >= src_pixel_count)
    {
        if (src_format == RF_UNCOMPRESSED_R32G32B32A32)
        {
            success = true;
            memcpy(dst, src, src_size);
        }
        else
        {
            success = true;

            #define RF_FOR_EACH_PIXEL for (rf_int dst_iter = 0, src_iter = 0; src_iter < src_size && dst_iter < dst_size; dst_iter++, src_iter += src_bpp)
            switch (src_format)
            {
                case RF_UNCOMPRESSED_GRAYSCALE:
                    RF_FOR_EACH_PIXEL
                    {
                        float value = ((unsigned char*)src)[src_iter] / 255.0f;

                        dst[dst_iter].x = value;
                        dst[dst_iter].y = value;
                        dst[dst_iter].z = value;
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_GRAY_ALPHA:
                    RF_FOR_EACH_PIXEL
                    {
                        float value0 = (float)((unsigned char*)src)[src_iter + 0] / 255.0f;
                        float value1 = (float)((unsigned char*)src)[src_iter + 1] / 255.0f;

                        dst[dst_iter].x = value0;
                        dst[dst_iter].y = value0;
                        dst[dst_iter].z = value0;
                        dst[dst_iter].w = value1;
                    }
                    break;

                case RF_UNCOMPRESSED_R5G5B5A1:
                    RF_FOR_EACH_PIXEL
                    {
                        unsigned short pixel = ((unsigned short*) src)[src_iter];

                        dst[dst_iter].x = (float)((pixel & 0b1111100000000000) >> 11) * (1.0f/31);
                        dst[dst_iter].y = (float)((pixel & 0b0000011111000000) >>  6) * (1.0f/31);
                        dst[dst_iter].z = (float)((pixel & 0b0000000000111110) >>  1) * (1.0f/31);
                        dst[dst_iter].w = ((pixel & 0b0000000000000001) == 0) ? 0.0f : 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R5G6B5:
                    RF_FOR_EACH_PIXEL
                    {
                        unsigned short pixel = ((unsigned short*)src)[src_iter];

                        dst[dst_iter].x = (float)((pixel & 0b1111100000000000) >> 11) * (1.0f / 31);
                        dst[dst_iter].y = (float)((pixel & 0b0000011111100000) >>  5) * (1.0f / 63);
                        dst[dst_iter].z = (float) (pixel & 0b0000000000011111)        * (1.0f / 31);
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R4G4B4A4:
                    RF_FOR_EACH_PIXEL
                    {
                        unsigned short pixel = ((unsigned short*)src)[src_iter];

                        dst[dst_iter].x = (float)((pixel & 0b1111000000000000) >> 12) * (1.0f / 15);
                        dst[dst_iter].y = (float)((pixel & 0b0000111100000000) >> 8)  * (1.0f / 15);
                        dst[dst_iter].z = (float)((pixel & 0b0000000011110000) >> 4)  * (1.0f / 15);
                        dst[dst_iter].w = (float) (pixel & 0b0000000000001111)        * (1.0f / 15);
                    }
                    break;

                case RF_UNCOMPRESSED_R8G8B8A8:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = (float)((unsigned char*)src)[src_iter + 0] / 255.0f;
                        dst[dst_iter].y = (float)((unsigned char*)src)[src_iter + 1] / 255.0f;
                        dst[dst_iter].z = (float)((unsigned char*)src)[src_iter + 2] / 255.0f;
                        dst[dst_iter].w = (float)((unsigned char*)src)[src_iter + 3] / 255.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R8G8B8:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = (float)((unsigned char*)src)[src_iter + 0] / 255.0f;
                        dst[dst_iter].y = (float)((unsigned char*)src)[src_iter + 1] / 255.0f;
                        dst[dst_iter].z = (float)((unsigned char*)src)[src_iter + 2] / 255.0f;
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R32:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = ((float*)src)[src_iter];
                        dst[dst_iter].y = 0.0f;
                        dst[dst_iter].z = 0.0f;
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R32G32B32:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = ((float*)src)[src_iter + 0];
                        dst[dst_iter].y = ((float*)src)[src_iter + 1];
                        dst[dst_iter].z = ((float*)src)[src_iter + 2];
                        dst[dst_iter].w = 1.0f;
                    }
                    break;

                case RF_UNCOMPRESSED_R32G32B32A32:
                    RF_FOR_EACH_PIXEL
                    {
                        dst[dst_iter].x = ((float*)src)[src_iter + 0];
                        dst[dst_iter].y = ((float*)src)[src_iter + 1];
                        dst[dst_iter].z = ((float*)src)[src_iter + 2];
                        dst[dst_iter].w = ((float*)src)[src_iter + 3];
                    }
                    break;

                default: break;
            }